

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies.cpp
# Opt level: O2

bool bidfx_public_api::price::Currencies::IsValidCurrencyAndPair(string *ccy,string *ccy_pair)

{
  string *psVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  psVar1 = (string *)ccy->_M_string_length;
  uVar3 = (long)ccy_pair->_M_string_length - (long)psVar1;
  if ((string *)ccy_pair->_M_string_length < psVar1 || uVar3 == 0) {
    bVar4 = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare((ulong)ccy_pair,uVar3,psVar1);
    if (iVar2 == 0) {
      bVar4 = true;
    }
    else {
      iVar2 = std::__cxx11::string::compare((ulong)ccy_pair,0,(string *)ccy->_M_string_length);
      bVar4 = iVar2 == 0;
    }
  }
  return bVar4;
}

Assistant:

bool Currencies::IsValidCurrencyAndPair(const std::string& ccy, const std::string& ccy_pair)
{
    return (ccy_pair.length() > ccy.length() && // currency fits into currency pair
               (ccy_pair.compare(ccy_pair.length() - ccy.length(), ccy.length(), ccy) == 0 || // currency at end of currency pair
                ccy_pair.compare(0, ccy.length(), ccy) == 0)); // currency at start of currency pair
}